

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::MetallicPaintMaterial> *material,ssize_t id)

{
  int in_EDX;
  int __oflag;
  long *in_RSI;
  XMLWriter *in_RDI;
  Vec3fa *in_stack_fffffffffffffeb0;
  allocator *paVar1;
  char *in_stack_fffffffffffffeb8;
  XMLWriter *in_stack_fffffffffffffec0;
  XMLWriter *this_00;
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  undefined1 local_b9 [33];
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  int local_40;
  
  local_40 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"material",&local_61);
  std::__cxx11::string::string(local_98,(string *)(*in_RSI + 0x30));
  open(in_RDI,(char *)local_60,local_40,local_98);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  store(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
  this_00 = (XMLWriter *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b9 + 1),"parameters",(allocator *)this_00);
  open(in_RDI,local_b9 + 1,__oflag);
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  store_parm(this_00,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  store_parm(this_00,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  store_parm(this_00,in_stack_fffffffffffffeb8,(float *)in_stack_fffffffffffffeb0);
  store_parm(this_00,in_stack_fffffffffffffeb8,(float *)in_stack_fffffffffffffeb0);
  paVar1 = &local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"parameters",paVar1);
  close(in_RDI,(int)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  paVar1 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"material",paVar1);
  close(in_RDI,(int)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  return;
}

Assistant:

void XMLWriter::store(Ref<MetallicPaintMaterial> material, ssize_t id)
  {
    open("material",id,material->name);
    store("code","MetallicPaint");
    open("parameters");
    store_parm("shadeColor",material->shadeColor);
    store_parm("glitterColor",material->glitterColor);
    store_parm("glitterSpread",material->glitterSpread);
    store_parm("eta",material->eta);
    close("parameters");
    close("material");
  }